

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O3

void __thiscall
TPZFront<float>::SymbolicAddKel(TPZFront<float> *this,TPZVec<long> *destinationindex)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = destinationindex->fNElements;
  if (lVar1 < 1) {
    lVar3 = this->fFront;
  }
  else {
    lVar4 = 0;
    do {
      Local(this,destinationindex->fStore[lVar4]);
      lVar3 = (this->fGlobal).super_TPZVec<long>.fNElements;
      this->fFront = lVar3;
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  iVar2 = (int)lVar3;
  if (lVar3 < this->fMaxFront) {
    iVar2 = this->fMaxFront;
  }
  this->fMaxFront = iVar2;
  return;
}

Assistant:

void TPZFront<TVar>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	int64_t i, loop_limit, aux;
	loop_limit=destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		aux=destinationindex[i];
		Local(aux);
		fFront = fGlobal.NElements();
	}
	fMaxFront=(fFront<fMaxFront)?fMaxFront:fFront;
	
}